

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

bool __thiscall
cmsys::CommandLineArguments::GetMatchedArguments
          (CommandLineArguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *matches,string *arg)

{
  _Base_ptr __n;
  int iVar1;
  Internal *pIVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(matches,(matches->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  pIVar2 = this->Internals;
  p_Var4 = *(_Base_ptr *)
            ((long)&(pIVar2->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  do {
    if ((_Rb_tree_header *)p_Var4 ==
        &(pIVar2->Callbacks).
         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      return (matches->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (matches->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (((ulong)p_Var4[2]._M_parent & 0xfffffffd) == 0) {
      __n = (_Base_ptr)arg->_M_string_length;
      if ((__n == p_Var4[1]._M_parent) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar1 = bcmp((arg->_M_dataplus)._M_p,*(void **)(p_Var4 + 1),(size_t)__n), iVar1 == 0))))
      {
LAB_0012048a:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(matches,(value_type *)(p_Var4 + 1));
      }
    }
    else {
      lVar3 = std::__cxx11::string::find((char *)arg,*(ulong *)(p_Var4 + 1),0);
      if (lVar3 == 0) goto LAB_0012048a;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    pIVar2 = this->Internals;
  } while( true );
}

Assistant:

bool CommandLineArguments::GetMatchedArguments(
  std::vector<std::string>* matches, const std::string& arg)
{
  matches->clear();
  CommandLineArguments::Internal::CallbacksMap::iterator it;

  // Does the argument match to any we know about?
  for (it = this->Internals->Callbacks.begin();
       it != this->Internals->Callbacks.end(); it++) {
    const CommandLineArguments::Internal::String& parg = it->first;
    CommandLineArgumentsCallbackStructure* cs = &it->second;
    if (cs->ArgumentType == CommandLineArguments::NO_ARGUMENT ||
        cs->ArgumentType == CommandLineArguments::SPACE_ARGUMENT) {
      if (arg == parg) {
        matches->push_back(parg);
      }
    } else if (arg.find(parg) == 0) {
      matches->push_back(parg);
    }
  }
  return !matches->empty();
}